

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O0

void Fra_ClausEstimateCoverage(Clu_Man_t *p)

{
  int iVar1;
  abctime aVar2;
  Fra_Sml_t *p_00;
  int *pVar2Id_00;
  Aig_Obj_t *pAVar3;
  uint *pResult;
  uint *puVar4;
  int *piVar5;
  abctime aVar6;
  abctime clk;
  int *pVar2Id;
  int *pStart;
  int local_40;
  int w;
  int i;
  int End;
  int Beg;
  int nCovered;
  uint *pResultOne;
  uint *pResultTot;
  Fra_Sml_t *pComb;
  int nCombSimWords;
  Clu_Man_t *p_local;
  
  aVar2 = Abc_Clock();
  Aig_ManRandom(1);
  p_00 = Fra_SmlSimulateComb(p->pAig,0x800,0);
  pVar2Id_00 = (int *)malloc((long)p->pCnf->nVars << 2);
  memset(pVar2Id_00,0,(long)p->pCnf->nVars << 2);
  local_40 = 0;
  do {
    iVar1 = Aig_ManObjNumMax(p->pAig);
    if (iVar1 <= local_40) {
      iVar1 = Aig_ManCoNum(p->pAig);
      if (2 < iVar1) {
        pAVar3 = Aig_ManCo(p->pAig,0);
        pResult = Fra_ObjSim(p_00,pAVar3->Id);
        pAVar3 = Aig_ManCo(p->pAig,1);
        puVar4 = Fra_ObjSim(p_00,pAVar3->Id);
        for (pStart._4_4_ = 0; pStart._4_4_ < 0x800; pStart._4_4_ = pStart._4_4_ + 1) {
          puVar4[pStart._4_4_] = 0;
        }
        i = 0;
        piVar5 = Vec_IntArray(p->vLitsProven);
        for (local_40 = 0; iVar1 = Vec_IntSize(p->vClausesProven), local_40 < iVar1;
            local_40 = local_40 + 1) {
          iVar1 = Vec_IntEntry(p->vClausesProven,local_40);
          Fra_ClausEstimateCoverageOne(p_00,piVar5 + i,iVar1 - i,pVar2Id_00,pResult);
          for (pStart._4_4_ = 0; pStart._4_4_ < 0x800; pStart._4_4_ = pStart._4_4_ + 1) {
            puVar4[pStart._4_4_] = pResult[pStart._4_4_] | puVar4[pStart._4_4_];
          }
          i = iVar1;
        }
        End = 0;
        for (pStart._4_4_ = 0; pStart._4_4_ < 0x800; pStart._4_4_ = pStart._4_4_ + 1) {
          iVar1 = Aig_WordCountOnes(puVar4[pStart._4_4_]);
          End = iVar1 + End;
        }
        Fra_SmlStop(p_00);
        if (pVar2Id_00 != (int *)0x0) {
          free(pVar2Id_00);
        }
        printf("Care states ratio = %f. ",((double)(0x10000 - End) * 1.0) / 65536.0);
        printf("(%d out of %d patterns)  ",(ulong)(0x10000 - End),0x10000);
        Abc_Print(1,"%s =","Time");
        aVar6 = Abc_Clock();
        Abc_Print(1,"%9.2f sec\n",((double)(aVar6 - aVar2) * 1.0) / 1000000.0);
        return;
      }
      __assert_fail("Aig_ManCoNum(p->pAig) > 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                    ,0x66a,"void Fra_ClausEstimateCoverage(Clu_Man_t *)");
    }
    if (-1 < p->pCnf->pVarNums[local_40]) {
      if (p->pCnf->nVars <= p->pCnf->pVarNums[local_40]) {
        __assert_fail("p->pCnf->pVarNums[i] < p->pCnf->nVars",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                      ,0x666,"void Fra_ClausEstimateCoverage(Clu_Man_t *)");
      }
      pVar2Id_00[p->pCnf->pVarNums[local_40]] = local_40;
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

void Fra_ClausEstimateCoverage( Clu_Man_t * p )
{
    int nCombSimWords = (1<<11);
    Fra_Sml_t * pComb;
    unsigned * pResultTot, * pResultOne;
    int nCovered, Beg, End, i, w;
    int * pStart, * pVar2Id; 
    abctime clk = Abc_Clock();
    // simulate the circuit with nCombSimWords * 32 = 64K patterns
//    srand( 0xAABBAABB );
    Aig_ManRandom(1);
    pComb = Fra_SmlSimulateComb( p->pAig, nCombSimWords, 0 );
    // create mapping from SAT vars to node IDs
    pVar2Id = ABC_ALLOC( int, p->pCnf->nVars );
    memset( pVar2Id, 0, sizeof(int) * p->pCnf->nVars );
    for ( i = 0; i < Aig_ManObjNumMax(p->pAig); i++ )
        if ( p->pCnf->pVarNums[i] >= 0 )
        {
            assert( p->pCnf->pVarNums[i] < p->pCnf->nVars );
            pVar2Id[ p->pCnf->pVarNums[i] ] = i;
        }
    // get storage for one assignment and all assignments
    assert( Aig_ManCoNum(p->pAig) > 2 );
    pResultOne = Fra_ObjSim( pComb, Aig_ManCo(p->pAig, 0)->Id );
    pResultTot = Fra_ObjSim( pComb, Aig_ManCo(p->pAig, 1)->Id );
    // start the OR of don't-cares
    for ( w = 0; w < nCombSimWords; w++ )
        pResultTot[w] = 0;
    // check clauses
    Beg = 0;
    pStart = Vec_IntArray( p->vLitsProven );
    Vec_IntForEachEntry( p->vClausesProven, End, i )
    {
        Fra_ClausEstimateCoverageOne( pComb, pStart + Beg, End-Beg, pVar2Id, pResultOne );
        Beg = End;
        for ( w = 0; w < nCombSimWords; w++ )
            pResultTot[w] |= pResultOne[w];
    }
    // count the total number of patterns contained in the don't-care
    nCovered = 0;
    for ( w = 0; w < nCombSimWords; w++ )
        nCovered += Aig_WordCountOnes( pResultTot[w] );
    Fra_SmlStop( pComb );
    ABC_FREE( pVar2Id );
    // print the result
    printf( "Care states ratio = %f. ", 1.0 * (nCombSimWords * 32 - nCovered) / (nCombSimWords * 32) );
    printf( "(%d out of %d patterns)  ", nCombSimWords * 32 - nCovered, nCombSimWords * 32 );
    ABC_PRT( "Time", Abc_Clock() - clk );
}